

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderCommonFunctionTests.cpp
# Opt level: O0

bool __thiscall
vkt::shaderexecutor::anon_unknown_0::FloatBitsToUintIntCaseInstance::compare
          (FloatBitsToUintIntCaseInstance *this,void **inputs,void **outputs)

{
  int value;
  const_reference pvVar1;
  ostream *poVar2;
  Hex<8UL> HVar3;
  Float<unsigned_int,_8,_23,_127,_3U> local_50;
  int ulpDiff;
  int local_48;
  deUint32 refOut0;
  deUint32 out0;
  float in0;
  int compNdx;
  int maxUlpDiff;
  int mantissaBits;
  int scalarSize;
  Precision precision;
  DataType type;
  void **outputs_local;
  void **inputs_local;
  FloatBitsToUintIntCaseInstance *this_local;
  
  _precision = outputs;
  outputs_local = inputs;
  inputs_local = (void **)this;
  pvVar1 = std::vector<vkt::shaderexecutor::Symbol,_std::allocator<vkt::shaderexecutor::Symbol>_>::
           operator[](&(this->super_CommonFunctionTestInstance).m_spec.inputs,0);
  scalarSize = glu::VarType::getBasicType(&pvVar1->varType);
  pvVar1 = std::vector<vkt::shaderexecutor::Symbol,_std::allocator<vkt::shaderexecutor::Symbol>_>::
           operator[](&(this->super_CommonFunctionTestInstance).m_spec.inputs,0);
  mantissaBits = glu::VarType::getPrecision(&pvVar1->varType);
  maxUlpDiff = glu::getDataTypeScalarSize(scalarSize);
  compNdx = getMinMantissaBits(mantissaBits);
  in0 = (float)getMaxUlpDiffFromBits(compNdx);
  out0 = 0;
  while( true ) {
    if (maxUlpDiff <= (int)out0) {
      return true;
    }
    refOut0 = *(deUint32 *)((long)*outputs_local + (long)(int)out0 * 4);
    local_48 = *(int *)((long)*_precision + (long)(int)out0 * 4);
    tcu::Float<unsigned_int,_8,_23,_127,_3U>::Float(&local_50,(float)refOut0);
    ulpDiff = tcu::Float<unsigned_int,_8,_23,_127,_3U>::bits(&local_50);
    value = de::abs<int>(local_48 - ulpDiff);
    if ((int)in0 < value) break;
    out0 = out0 + 1;
  }
  poVar2 = std::operator<<((ostream *)&(this->super_CommonFunctionTestInstance).m_failMsg,
                           "Expected [");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,out0);
  poVar2 = std::operator<<(poVar2,"] = ");
  HVar3 = tcu::toHex<unsigned_int>(ulpDiff);
  poVar2 = tcu::Format::operator<<(poVar2,HVar3);
  poVar2 = std::operator<<(poVar2," with threshold ");
  HVar3 = tcu::toHex<int>((int)in0);
  poVar2 = tcu::Format::operator<<(poVar2,HVar3);
  poVar2 = std::operator<<(poVar2,", got diff ");
  HVar3 = tcu::toHex<int>(value);
  tcu::Format::operator<<(poVar2,HVar3);
  return false;
}

Assistant:

bool compare (const void* const* inputs, const void* const* outputs)
	{
		const glu::DataType		type			= m_spec.inputs[0].varType.getBasicType();
		const glu::Precision	precision		= m_spec.inputs[0].varType.getPrecision();
		const int				scalarSize		= glu::getDataTypeScalarSize(type);

		const int				mantissaBits	= getMinMantissaBits(precision);
		const int				maxUlpDiff		= getMaxUlpDiffFromBits(mantissaBits);

		for (int compNdx = 0; compNdx < scalarSize; compNdx++)
		{
			const float		in0			= ((const float*)inputs[0])[compNdx];
			const deUint32	out0		= ((const deUint32*)outputs[0])[compNdx];
			const deUint32	refOut0		= tcu::Float32(in0).bits();
			const int		ulpDiff		= de::abs((int)out0 - (int)refOut0);

			if (ulpDiff > maxUlpDiff)
			{
				m_failMsg << "Expected [" << compNdx << "] = " << tcu::toHex(refOut0) << " with threshold "
							<< tcu::toHex(maxUlpDiff) << ", got diff " << tcu::toHex(ulpDiff);
				return false;
			}
		}

		return true;
	}